

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag_set.cpp
# Opt level: O3

void check_set(flag_set<test_flags> *set,bool a,bool b,bool c)

{
  int_type iVar1;
  flag_set<test_flags> *pfVar2;
  undefined8 uVar3;
  Flags FVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  byte bVar5;
  undefined7 in_register_00000031;
  byte bVar6;
  bool bVar7;
  AssertionHandler catchAssertionHandler;
  byte local_344 [4];
  SourceLineInfo local_340;
  flag_set<test_flags> *local_330;
  AssertionHandler local_328;
  ITransientExpression local_2e0;
  flag_set<test_flags> *local_2d0;
  char *pcStack_2c8;
  size_t local_2c0;
  flag_set<test_flags> *local_2b8;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_2a4 = (uint)CONCAT71(in_register_00000009,c);
  local_2ac = (uint)CONCAT71(in_register_00000011,b);
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x20;
  Catch::StringRef::StringRef(&local_40,"set.is_set(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_40,Normal);
  bVar6 = (set->flags_).bits_;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  uVar3 = local_2e0._8_8_;
  local_2e0._8_2_ = CONCAT11((bool)(bVar6 & 1) == a,true);
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f708;
  local_2e0._11_5_ = SUB85(uVar3,3);
  local_2e0._8_8_ = CONCAT53(local_2e0._11_5_,CONCAT12(bVar6,local_2e0._8_2_)) & 0xffffffffff01ffff;
  local_2d0 = (flag_set<test_flags> *)local_340.file;
  pcStack_2c8 = (char *)local_340.line;
  local_2a8 = (uint)CONCAT71(in_register_00000031,a);
  local_2c0 = CONCAT71(local_2c0._1_7_,a);
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x21;
  Catch::StringRef::StringRef(&local_50,"set.as_flag(test_flags::a) == a");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_50,Normal);
  local_344[0] = (set->flags_).bits_ & 1;
  bVar7 = local_344[0] == 0;
  bVar6 = (byte)local_2a8;
  local_330 = set;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  local_2e0.m_result = (bool)(bVar7 ^ bVar6);
  local_2e0.m_isBinaryExpression = true;
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fa30;
  pcStack_2c8 = local_340.file;
  local_2c0 = local_340.line;
  local_2b8 = (flag_set<test_flags> *)CONCAT71(local_2b8._1_7_,bVar6);
  local_2d0 = (flag_set<test_flags> *)local_344;
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  pfVar2 = local_330;
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((char)local_2a8 != '\0') {
    local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_2e0.m_isBinaryExpression = true;
    local_2e0.m_result = false;
    local_2e0._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x23;
    Catch::StringRef::StringRef(&local_60,"(set & test_flags::a)");
    Catch::AssertionHandler::AssertionHandler
              (&local_328,(StringRef *)&local_2e0,&local_340,local_60,Normal);
    local_2e0._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_) &
         0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
    Catch::AssertionHandler::complete(&local_328);
    if (local_328.m_completed == false) {
      (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x25;
  Catch::StringRef::StringRef(&local_70,"set.is_set(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_70,Normal);
  bVar6 = (pfVar2->flags_).bits_ >> 1;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  uVar3 = local_2e0._8_8_;
  local_2e0._8_2_ = CONCAT11((bVar6 & 1) == (byte)local_2ac,true);
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f708;
  local_2e0._11_5_ = SUB85(uVar3,3);
  local_2e0._8_8_ = CONCAT53(local_2e0._11_5_,CONCAT12(bVar6,local_2e0._8_2_)) & 0xffffffffff01ffff;
  local_2d0 = (flag_set<test_flags> *)local_340.file;
  pcStack_2c8 = (char *)local_340.line;
  local_2c0 = CONCAT71(local_2c0._1_7_,(byte)local_2ac);
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x26;
  Catch::StringRef::StringRef(&local_80,"set.as_flag(test_flags::b) == b");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_80,Normal);
  bVar6 = (pfVar2->flags_).bits_ & 2;
  local_344[0] = bVar6 >> 1;
  bVar5 = (byte)local_2ac;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  local_2e0.m_result = (bool)(bVar6 == 0 ^ bVar5);
  local_2e0.m_isBinaryExpression = true;
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fa30;
  local_2d0 = (flag_set<test_flags> *)local_344;
  pcStack_2c8 = local_340.file;
  local_2c0 = local_340.line;
  local_2b8 = (flag_set<test_flags> *)CONCAT71(local_2b8._1_7_,bVar5);
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((byte)local_2ac != '\0') {
    local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_2e0.m_isBinaryExpression = true;
    local_2e0.m_result = false;
    local_2e0._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x28;
    Catch::StringRef::StringRef(&local_90,"(set & test_flags::b)");
    Catch::AssertionHandler::AssertionHandler
              (&local_328,(StringRef *)&local_2e0,&local_340,local_90,Normal);
    local_2e0._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ >> 1) &
         0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
    Catch::AssertionHandler::complete(&local_328);
    if (local_328.m_completed == false) {
      (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x2a;
  Catch::StringRef::StringRef(&local_a0,"set.is_set(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_a0,Normal);
  bVar6 = (pfVar2->flags_).bits_ >> 2;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  uVar3 = local_2e0._8_8_;
  local_2e0._8_2_ = CONCAT11((bVar6 & 1) == (byte)local_2a4,true);
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f708;
  local_2e0._11_5_ = SUB85(uVar3,3);
  local_2e0._8_8_ = CONCAT53(local_2e0._11_5_,CONCAT12(bVar6,local_2e0._8_2_)) & 0xffffffffff01ffff;
  local_2d0 = (flag_set<test_flags> *)local_340.file;
  pcStack_2c8 = (char *)local_340.line;
  local_2c0 = CONCAT71(local_2c0._1_7_,(byte)local_2a4);
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x2b;
  Catch::StringRef::StringRef(&local_b0,"set.as_flag(test_flags::c) == c");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_b0,Normal);
  bVar6 = (pfVar2->flags_).bits_ & 4;
  local_344[0] = bVar6 >> 2;
  bVar5 = (byte)local_2a4;
  Catch::StringRef::StringRef((StringRef *)&local_340,"==");
  local_2e0.m_result = (bool)(bVar6 == 0 ^ bVar5);
  local_2e0.m_isBinaryExpression = true;
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fa30;
  local_2d0 = (flag_set<test_flags> *)local_344;
  pcStack_2c8 = local_340.file;
  local_2c0 = local_340.line;
  local_2b8 = (flag_set<test_flags> *)CONCAT71(local_2b8._1_7_,bVar5);
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((char)local_2a4 == '\0') {
    if ((byte)((byte)local_2a8 | (byte)local_2ac) != 1) {
      local_2e0._vptr_ITransientExpression = (_func_int **)0x1e7468;
      local_2e0.m_isBinaryExpression = true;
      local_2e0.m_result = false;
      local_2e0._10_6_ = 0;
      local_340.file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
      ;
      local_340.line = 0x38;
      Catch::StringRef::StringRef(&local_110,"set.any()");
      FVar4 = Catch::operator|(Normal,FalseTest);
      Catch::AssertionHandler::AssertionHandler
                (&local_328,(StringRef *)&local_2e0,&local_340,local_110,FVar4);
      local_2e0._vptr_ITransientExpression =
           (_func_int **)
           CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ != '\0');
      Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
      Catch::AssertionHandler::complete(&local_328);
      if (local_328.m_completed == false) {
        (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
      local_2e0.m_isBinaryExpression = true;
      local_2e0.m_result = false;
      local_2e0._10_6_ = 0;
      local_340.file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
      ;
      local_340.line = 0x39;
      Catch::StringRef::StringRef(&local_120,"set.none()");
      Catch::AssertionHandler::AssertionHandler
                (&local_328,(StringRef *)&local_2e0,&local_340,local_120,Normal);
      local_2e0._vptr_ITransientExpression =
           (_func_int **)
           CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ == '\0');
      Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
      Catch::AssertionHandler::complete(&local_328);
      if (local_328.m_completed == false) {
        (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
      local_2e0.m_isBinaryExpression = true;
      local_2e0.m_result = false;
      local_2e0._10_6_ = 0;
      local_340.file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
      ;
      local_340.line = 0x3a;
      Catch::StringRef::StringRef(&local_130,"set == type_safe::noflag");
      Catch::AssertionHandler::AssertionHandler
                (&local_328,(StringRef *)&local_2e0,&local_340,local_130,Normal);
      iVar1 = (pfVar2->flags_).bits_;
      Catch::StringRef::StringRef((StringRef *)&local_340,"==");
      local_2e0.m_result = iVar1 == '\0';
      local_2e0.m_isBinaryExpression = true;
      local_2e0._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_0022fa70;
      local_2d0 = pfVar2;
      pcStack_2c8 = local_340.file;
      local_2c0 = local_340.line;
      local_2b8 = (flag_set<test_flags> *)&type_safe::noflag;
      Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
      Catch::ITransientExpression::~ITransientExpression(&local_2e0);
      Catch::AssertionHandler::complete(&local_328);
      if (local_328.m_completed == false) {
        (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
      local_2e0.m_isBinaryExpression = true;
      local_2e0.m_result = false;
      local_2e0._10_6_ = 0;
      local_340.file =
           "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
      ;
      local_340.line = 0x3b;
      Catch::StringRef::StringRef(&local_140,"type_safe::noflag == set");
      Catch::AssertionHandler::AssertionHandler
                (&local_328,(StringRef *)&local_2e0,&local_340,local_140,Normal);
      iVar1 = (pfVar2->flags_).bits_;
      Catch::StringRef::StringRef((StringRef *)&local_340,"==");
      local_2e0.m_result = iVar1 == '\0';
      local_2e0.m_isBinaryExpression = true;
      local_2e0._vptr_ITransientExpression =
           (_func_int **)&PTR_streamReconstructedExpression_0022fab0;
      local_2d0 = (flag_set<test_flags> *)&type_safe::noflag;
      pcStack_2c8 = local_340.file;
      local_2c0 = local_340.line;
      local_2b8 = pfVar2;
      Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
      Catch::ITransientExpression::~ITransientExpression(&local_2e0);
      Catch::AssertionHandler::complete(&local_328);
      if (local_328.m_completed == false) {
        (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      (*(code *)(&DAT_001e72e4 +
                *(int *)(&DAT_001e72e4 +
                        (ulong)(local_2a4 & 0xff | (local_2a8 & 0xff) * 4 + (local_2ac & 0xff) * 2)
                        * 4)))();
      return;
    }
  }
  else {
    local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
    local_2e0.m_isBinaryExpression = true;
    local_2e0.m_result = false;
    local_2e0._10_6_ = 0;
    local_340.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp"
    ;
    local_340.line = 0x2d;
    Catch::StringRef::StringRef(&local_c0,"(set & test_flags::c)");
    Catch::AssertionHandler::AssertionHandler
              (&local_328,(StringRef *)&local_2e0,&local_340,local_c0,Normal);
    local_2e0._vptr_ITransientExpression =
         (_func_int **)
         (CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ >> 2) &
         0xffffffffffffff01);
    Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
    Catch::AssertionHandler::complete(&local_328);
    if (local_328.m_completed == false) {
      (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x31;
  Catch::StringRef::StringRef(&local_d0,"set.any()");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_d0,Normal);
  local_2e0._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ != '\0');
  Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e7468;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x32;
  Catch::StringRef::StringRef(&local_e0,"set.none()");
  FVar4 = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_e0,FVar4);
  local_2e0._vptr_ITransientExpression =
       (_func_int **)
       CONCAT71(local_2e0._vptr_ITransientExpression._1_7_,(pfVar2->flags_).bits_ == '\0');
  Catch::AssertionHandler::handleExpr<bool>(&local_328,(ExprLhs<bool> *)&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x33;
  Catch::StringRef::StringRef(&local_f0,"set != type_safe::noflag");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_f0,Normal);
  iVar1 = (pfVar2->flags_).bits_;
  Catch::StringRef::StringRef((StringRef *)&local_340,"!=");
  local_2e0.m_result = iVar1 != '\0';
  local_2e0.m_isBinaryExpression = true;
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fa70;
  local_2d0 = pfVar2;
  pcStack_2c8 = local_340.file;
  local_2c0 = local_340.line;
  local_2b8 = (flag_set<test_flags> *)&type_safe::noflag;
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_2e0._vptr_ITransientExpression = (_func_int **)0x1e496b;
  local_2e0.m_isBinaryExpression = true;
  local_2e0.m_result = false;
  local_2e0._10_6_ = 0;
  local_340.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/flag_set.cpp";
  local_340.line = 0x34;
  Catch::StringRef::StringRef(&local_100,"type_safe::noflag != set");
  Catch::AssertionHandler::AssertionHandler
            (&local_328,(StringRef *)&local_2e0,&local_340,local_100,Normal);
  iVar1 = (pfVar2->flags_).bits_;
  Catch::StringRef::StringRef((StringRef *)&local_340,"!=");
  local_2e0.m_result = iVar1 != '\0';
  local_2e0.m_isBinaryExpression = true;
  local_2e0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022fab0;
  local_2d0 = (flag_set<test_flags> *)&type_safe::noflag;
  pcStack_2c8 = local_340.file;
  local_2c0 = local_340.line;
  local_2b8 = pfVar2;
  Catch::AssertionHandler::handleExpr(&local_328,&local_2e0);
  Catch::ITransientExpression::~ITransientExpression(&local_2e0);
  Catch::AssertionHandler::complete(&local_328);
  if (local_328.m_completed == false) {
    (*(local_328.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  (*(code *)(&DAT_001e72e4 +
            *(int *)(&DAT_001e72e4 +
                    (ulong)(local_2a4 & 0xff | (local_2a8 & 0xff) * 4 + (local_2ac & 0xff) * 2) * 4)
            ))();
  return;
}

Assistant:

void check_set(const type_safe::flag_set<test_flags>& set, bool a, bool b, bool c)
{
    REQUIRE(set.is_set(test_flags::a) == a);
    REQUIRE(set.as_flag(test_flags::a) == a);
    if (a)
        REQUIRE((set & test_flags::a));

    REQUIRE(set.is_set(test_flags::b) == b);
    REQUIRE(set.as_flag(test_flags::b) == b);
    if (b)
        REQUIRE((set & test_flags::b));

    REQUIRE(set.is_set(test_flags::c) == c);
    REQUIRE(set.as_flag(test_flags::c) == c);
    if (c)
        REQUIRE((set & test_flags::c));

    if (a || b || c)
    {
        REQUIRE(set.any());
        REQUIRE_FALSE(set.none());
        REQUIRE(set != type_safe::noflag);
        REQUIRE(type_safe::noflag != set);
    }
    else
    {
        REQUIRE_FALSE(set.any());
        REQUIRE(set.none());
        REQUIRE(set == type_safe::noflag);
        REQUIRE(type_safe::noflag == set);
    }

    auto number = (a ? 4 : 0) + (b ? 2 : 0) + (c ? 1 : 0);
    switch (number)
    {
    case 0:
        REQUIRE(set == type_safe::flag_set<test_flags>());
        break;
    case 1:
        REQUIRE(set == test_flags::c);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::b));
        REQUIRE((set & test_flags::c));
        break;
    case 2:
        REQUIRE(set == test_flags::b);
        REQUIRE(set == type_safe::combo(~test_flags::a & ~test_flags::c));
        REQUIRE((set & test_flags::b));
        break;
    case 3:
        REQUIRE(set == (test_flags::b | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::a));
        REQUIRE((set & (test_flags::b | test_flags::c)));
        break;
    case 4:
        REQUIRE(set == test_flags::a);
        REQUIRE(set == type_safe::combo(~test_flags::b & ~test_flags::c));
        REQUIRE((set & test_flags::a));
        break;
    case 5:
        REQUIRE(set == (test_flags::a | test_flags::c));
        REQUIRE(set == type_safe::combo(~test_flags::b));
        REQUIRE((set & (test_flags::a | test_flags::c)));
        break;
    case 6:
        REQUIRE(set == (test_flags::a | test_flags::b));
        REQUIRE(set == type_safe::combo(~test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b)));
        break;
    case 7:
        REQUIRE(set.all());
        REQUIRE(set == (test_flags::a | test_flags::b | test_flags::c));
        REQUIRE((set & (test_flags::a | test_flags::b | test_flags::c)));
        break;

    default:
        REQUIRE(false);
        break;
    }
}